

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

void __thiscall QDockWidgetPrivate::endDrag(QDockWidgetPrivate *this,EndDragMode mode)

{
  QWidget *this_00;
  DragState *pDVar1;
  QWidgetData *pQVar2;
  Representation RVar3;
  Representation RVar4;
  Representation RVar5;
  bool bVar6;
  DockWidgetArea area;
  TabPosition TVar7;
  QMainWindow *mainWindow;
  QMainWindowLayout *this_01;
  QDockWidgetLayout *this_02;
  QDockWidgetGroupWindow *pQVar8;
  QDockAreaLayoutInfo *pQVar9;
  QWidget *pQVar10;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QWidget::releaseMouse(this_00);
  pQVar10 = this_00;
  if (this->state->dragging != true) goto LAB_00407963;
  do {
    pQVar10 = *(QWidget **)(*(long *)&pQVar10->field_0x8 + 0x10);
    if (pQVar10 == (QWidget *)0x0) {
      mainWindow = (QMainWindow *)0x0;
      break;
    }
    mainWindow = (QMainWindow *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
  } while (mainWindow == (QMainWindow *)0x0);
  this_01 = qt_mainwindow_layout(mainWindow);
  if (this_01 == (QMainWindowLayout *)0x0) {
    return;
  }
  if ((mode != Abort) &&
     (bVar6 = QMainWindowLayout::plug((QMainWindowLayout *)this_01,this->state->widgetItem), bVar6))
  goto LAB_00407963;
  pDVar1 = this->state;
  if (((this->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
       super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 4) == 0) {
    QMainWindowLayout::revert((QMainWindowLayout *)this_01,pDVar1->widgetItem);
    goto LAB_00407963;
  }
  if (pDVar1->ownWidgetItem == true) {
    if (pDVar1->widgetItem != (QLayoutItem *)0x0) {
      (*pDVar1->widgetItem->_vptr_QLayoutItem[1])();
    }
    this->state->widgetItem = (QLayoutItem *)0x0;
  }
  QMainWindowLayout::restore((QMainWindowLayout *)this_01,false);
  this_02 = (QDockWidgetLayout *)QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
  bVar6 = QDockWidgetLayout::nativeWindowDeco(this_02);
  if (bVar6) {
    setResizerActive(this,false);
  }
  else {
    QWidget::setWindowFlags
              (this_00,(WindowFlags)
                       ((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                        super_QFlagsStorage<Qt::WindowType>.i & 0xfffffbff));
    setResizerActive(this,(bool)((byte)(this_00->data->window_flags).
                                       super_QFlagsStorageHelper<Qt::WindowType,_4>.
                                       super_QFlagsStorage<Qt::WindowType>.i & 1));
    QWidget::show(this_00);
  }
  pQVar2 = this_00->data;
  if (((pQVar2->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
    RVar3.m_i = (pQVar2->crect).y1.m_i;
    RVar4.m_i = (pQVar2->crect).x2.m_i;
    RVar5.m_i = (pQVar2->crect).y2.m_i;
    (this->undockedGeometry).x1 = (Representation)(pQVar2->crect).x1.m_i;
    (this->undockedGeometry).y1 = (Representation)RVar3.m_i;
    (this->undockedGeometry).x2 = (Representation)RVar4.m_i;
    (this->undockedGeometry).y2 = (Representation)RVar5.m_i;
    area = QMainWindow::dockWidgetArea(mainWindow,(QDockWidget *)this_00);
    if (area == NoDockWidgetArea) {
      pQVar8 = (QDockWidgetGroupWindow *)
               QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
      if (pQVar8 != (QDockWidgetGroupWindow *)0x0) {
        pQVar9 = QDockWidgetGroupWindow::layoutInfo(pQVar8);
        area = NoDockWidgetArea;
        if ((ulong)pQVar9->dockPos < 4) {
          area = *(DockWidgetArea *)(&DAT_006e3ed0 + (ulong)pQVar9->dockPos * 4);
        }
        goto LAB_00407923;
      }
    }
    else {
LAB_00407923:
      TVar7 = QMainWindowLayout::tabPosition((QMainWindowLayout *)this_01,area);
      *(TabPosition *)&(this->super_QWidgetPrivate).field_0x254 = TVar7;
    }
    if ((mode == LocationChange) &&
       (pQVar8 = (QDockWidgetGroupWindow *)
                 QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject),
       pQVar8 != (QDockWidgetGroupWindow *)0x0)) {
      QDockWidgetGroupWindow::reparentToMainWindow(pQVar8,(QDockWidget *)this_00);
    }
  }
  QWidget::activateWindow(this_00);
LAB_00407963:
  if (this->state != (DragState *)0x0) {
    operator_delete(this->state,0x30);
  }
  this->state = (DragState *)0x0;
  return;
}

Assistant:

void QDockWidgetPrivate::endDrag(EndDragMode mode)
{
    Q_Q(QDockWidget);
    Q_ASSERT(state != nullptr);

    q->releaseMouse();

    if (state->dragging) {
        const QMainWindow *mainWindow = mainwindow_from_dock(q);
        Q_ASSERT(mainWindow != nullptr);
        QMainWindowLayout *mwLayout = qt_mainwindow_layout(mainWindow);

        // if mainWindow is being deleted in an ongoing drag, make it a no-op instead of crashing
        if (!mwLayout)
            return;

        if (mode == EndDragMode::Abort || !mwLayout->plug(state->widgetItem)) {
            if (hasFeature(this, QDockWidget::DockWidgetFloatable)) {
                // This QDockWidget will now stay in the floating state.
                if (state->ownWidgetItem) {
                    delete state->widgetItem;
                    state->widgetItem = nullptr;
                }
                mwLayout->restore();
                QDockWidgetLayout *dwLayout = qobject_cast<QDockWidgetLayout*>(layout);
                if (!dwLayout->nativeWindowDeco()) {
                    // get rid of the X11BypassWindowManager window flag and activate the resizer
                    Qt::WindowFlags flags = q->windowFlags();
                    flags &= ~Qt::X11BypassWindowManagerHint;
                    q->setWindowFlags(flags);
                    setResizerActive(q->isFloating());
                    q->show();
                } else {
                    setResizerActive(false);
                }
                if (q->isFloating()) { // Might not be floating when dragging a QDockWidgetGroupWindow
                    undockedGeometry = q->geometry();
#if QT_CONFIG(tabwidget)
                    // is the widget located within the mainwindow?
                    const Qt::DockWidgetArea area = mainWindow->dockWidgetArea(q);
                    if (area != Qt::NoDockWidgetArea) {
                        tabPosition = mwLayout->tabPosition(area);
                    } else if (auto dwgw = qobject_cast<QDockWidgetGroupWindow *>(q->parent())) {
                        // DockWidget wasn't found in one of the docks within mainwindow
                        // => derive tabPosition from parent
                        tabPosition = mwLayout->tabPosition(toDockWidgetArea(dwgw->layoutInfo()->dockPos));
                    }
#endif
                    // Reparent, if the drag was out of a dock widget group window
                    if (mode == EndDragMode::LocationChange) {
                        if (auto *groupWindow = qobject_cast<QDockWidgetGroupWindow *>(q->parentWidget()))
                            groupWindow->reparentToMainWindow(q);
                    }
                }
                q->activateWindow();
            } else {
                // The tab was not plugged back in the QMainWindow but the QDockWidget cannot
                // stay floating, revert to the previous state.
                mwLayout->revert(state->widgetItem);
            }
        }
    }
    delete state;
    state = nullptr;
}